

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O3

void secp256k1_scratch_destroy(secp256k1_callback *error_callback,secp256k1_scratch *scratch)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  byte *extraout_RDX;
  secp256k1_fe sStack_160;
  secp256k1_fe sStack_130;
  secp256k1_fe sStack_100;
  secp256k1_ge sStack_d0;
  secp256k1_fe sStack_68;
  
  if (scratch == (secp256k1_scratch *)0x0) {
    return;
  }
  lVar2 = 0;
  pcVar3 = "scratch";
  do {
    if (scratch->magic[lVar2] != "scratch"[lVar2]) {
      (*error_callback->fn)("invalid scratch space",error_callback->data);
      return;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  if (scratch->alloc_size == 0) {
    free(scratch);
    return;
  }
  secp256k1_scratch_destroy_cold_1();
  if (error_callback == (secp256k1_callback *)0x0) {
    secp256k1_ec_pubkey_parse_cold_3();
  }
  else if (scratch != (secp256k1_scratch *)0x0) {
    scratch[1].alloc_size = 0;
    scratch[1].max_size = 0;
    scratch[1].magic[0] = '\0';
    scratch[1].magic[1] = '\0';
    scratch[1].magic[2] = '\0';
    scratch[1].magic[3] = '\0';
    scratch[1].magic[4] = '\0';
    scratch[1].magic[5] = '\0';
    scratch[1].magic[6] = '\0';
    scratch[1].magic[7] = '\0';
    scratch[1].data = (void *)0x0;
    scratch->alloc_size = 0;
    scratch->max_size = 0;
    scratch->magic[0] = '\0';
    scratch->magic[1] = '\0';
    scratch->magic[2] = '\0';
    scratch->magic[3] = '\0';
    scratch->magic[4] = '\0';
    scratch->magic[5] = '\0';
    scratch->magic[6] = '\0';
    scratch->magic[7] = '\0';
    scratch->data = (void *)0x0;
    if (extraout_RDX == (byte *)0x0) {
      secp256k1_ec_pubkey_parse_cold_1();
      return;
    }
    if (pcVar3 == (char *)0x41) {
      if (7 < *extraout_RDX) {
        return;
      }
      if ((0xd0U >> (*extraout_RDX & 0x1f) & 1) == 0) {
        return;
      }
      secp256k1_fe_impl_set_b32_mod(&sStack_130,extraout_RDX + 1);
      iVar1 = 0;
      if (((sStack_130.n[0] < 0xffffefffffc2f) || (sStack_130.n[4] != 0xffffffffffff)) ||
         ((sStack_130.n[2] & sStack_130.n[3] & sStack_130.n[1]) != 0xfffffffffffff)) {
        sStack_130.magnitude = 1;
        sStack_130.normalized = 1;
        secp256k1_fe_verify(&sStack_130);
        secp256k1_fe_impl_set_b32_mod(&sStack_160,extraout_RDX + 0x21);
        if (((sStack_160.n[0] < 0xffffefffffc2f) || (sStack_160.n[4] != 0xffffffffffff)) ||
           ((sStack_160.n[2] & sStack_160.n[3] & sStack_160.n[1]) != 0xfffffffffffff)) {
          sStack_160.magnitude = 1;
          sStack_160.normalized = 1;
          secp256k1_fe_verify(&sStack_160);
          secp256k1_ge_set_xy(&sStack_d0,&sStack_130,&sStack_160);
          if (((*extraout_RDX & 0xfe) != 6) ||
             (secp256k1_fe_verify(&sStack_160),
             (*extraout_RDX != 7) != (bool)((byte)sStack_160.n[0] & 1))) {
            secp256k1_ge_verify(&sStack_d0);
            iVar1 = 0;
            if (sStack_d0.infinity == 0) {
              secp256k1_fe_sqr(&sStack_100,&sStack_d0.y);
              secp256k1_fe_sqr(&sStack_68,&sStack_d0.x);
              secp256k1_fe_mul(&sStack_68,&sStack_68,&sStack_d0.x);
              secp256k1_fe_verify(&sStack_68);
              sStack_68.n[0] = sStack_68.n[0] + 2;
              sStack_68.magnitude = sStack_68.magnitude + 1;
              sStack_68.normalized = 0;
              secp256k1_fe_verify(&sStack_68);
              iVar1 = secp256k1_fe_equal(&sStack_100,&sStack_68);
            }
          }
        }
      }
    }
    else {
      if (pcVar3 != (char *)0x21) {
        return;
      }
      if ((*extraout_RDX & 0xfe) != 2) {
        return;
      }
      secp256k1_fe_impl_set_b32_mod(&sStack_100,extraout_RDX + 1);
      if (((sStack_100.n[0] < 0xffffefffffc2f) || (sStack_100.n[4] != 0xffffffffffff)) ||
         (iVar1 = 0, (sStack_100.n[2] & sStack_100.n[3] & sStack_100.n[1]) != 0xfffffffffffff)) {
        sStack_100.magnitude = 1;
        sStack_100.normalized = 1;
        secp256k1_fe_verify(&sStack_100);
        iVar1 = secp256k1_ge_set_xo_var(&sStack_d0,&sStack_100,(uint)(*extraout_RDX == 3));
      }
    }
    if (iVar1 == 0) {
      return;
    }
    iVar1 = secp256k1_ge_is_in_correct_subgroup(&sStack_d0);
    if (iVar1 == 0) {
      return;
    }
    secp256k1_pubkey_save((secp256k1_pubkey *)scratch,&sStack_d0);
    secp256k1_ge_clear(&sStack_d0);
    return;
  }
  secp256k1_ec_pubkey_parse_cold_2();
  return;
}

Assistant:

static void secp256k1_scratch_destroy(const secp256k1_callback* error_callback, secp256k1_scratch* scratch) {
    if (scratch != NULL) {
        if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
            secp256k1_callback_call(error_callback, "invalid scratch space");
            return;
        }
        VERIFY_CHECK(scratch->alloc_size == 0); /* all checkpoints should be applied */
        memset(scratch->magic, 0, sizeof(scratch->magic));
        free(scratch);
    }
}